

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

ByteData *
cfd::core::Psbt::CreateFixRecordKey
          (ByteData *__return_storage_ptr__,uint8_t type,ByteData *fixed_size_key)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  ByteData::ByteData((ByteData *)&local_30,type);
  ByteData::Concat<cfd::core::ByteData>(__return_storage_ptr__,(ByteData *)&local_30,fixed_size_key)
  ;
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

ByteData Psbt::CreateFixRecordKey(
    uint8_t type, const ByteData &fixed_size_key) {
  return ByteData(type).Concat(fixed_size_key);
}